

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegisterAllocation.cpp
# Opt level: O1

int countSpilled(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 *tempToColorMap)

{
  _Base_ptr p_Var1;
  _Rb_tree_header *p_Var2;
  int iVar3;
  bool bVar4;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  entry;
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  _Rb_tree_color local_38;
  
  p_Var1 = (tempToColorMap->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(tempToColorMap->_M_t)._M_impl.super__Rb_tree_header;
  iVar3 = 0;
  if ((_Rb_tree_header *)p_Var1 != p_Var2) {
    do {
      local_58[0] = local_48;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_58,*(long *)(p_Var1 + 1),
                 (long)&(p_Var1[1]._M_parent)->_M_color + *(long *)(p_Var1 + 1));
      local_38 = p_Var1[2]._M_color;
      bVar4 = local_38 == IN_MEMORY_COLOR;
      if (local_58[0] != local_48) {
        operator_delete(local_58[0]);
      }
      iVar3 = iVar3 + (uint)bVar4;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1);
    } while ((_Rb_tree_header *)p_Var1 != p_Var2);
  }
  return iVar3;
}

Assistant:

int countSpilled(std::map<std::string, int>& tempToColorMap) {
    int count = 0;
    for (auto entry : tempToColorMap) {
        if (entry.second == IN_MEMORY_COLOR) {
            ++count;
        }
    }

    return count;
}